

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cc
# Opt level: O0

void __thiscall benchmark::internal::BenchmarkImp::Range(BenchmarkImp *this,int start,int limit)

{
  initializer_list<int> __l;
  bool bVar1;
  int iVar2;
  reference piVar3;
  CheckHandler *in_RDI;
  int i;
  iterator __end2;
  iterator __begin2;
  vector<int,_std::allocator<int>_> *__range2;
  vector<int,_std::allocator<int>_> arglist;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff38;
  BenchmarkImp *in_stack_ffffffffffffff40;
  char *in_stack_ffffffffffffff48;
  char *in_stack_ffffffffffffff50;
  vector<int,_std::allocator<int>_> *this_00;
  CheckHandler *this_01;
  undefined4 in_stack_ffffffffffffff68;
  vector<int,_std::allocator<int>_> *this_02;
  iterator piVar4;
  size_type in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff94;
  int in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffa0;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_58;
  vector<int,_std::allocator<int>_> *local_50;
  vector<int,_std::allocator<int>_> local_48;
  byte local_19;
  CheckHandler local_18 [3];
  
  iVar2 = ArgsCnt(in_stack_ffffffffffffff40);
  local_19 = 0;
  if (iVar2 != -1) {
    iVar2 = ArgsCnt(in_stack_ffffffffffffff40);
    if (iVar2 != 1) {
      this_01 = local_18;
      CheckHandler::CheckHandler
                (in_RDI,(char *)this_01,in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                 (int)((ulong)in_stack_ffffffffffffff40 >> 0x20));
      local_19 = 1;
      CheckHandler::GetLog(this_01);
      goto LAB_001658d5;
    }
  }
  GetNullLogInstance();
LAB_001658d5:
  if ((local_19 & 1) == 0) {
    this_00 = &local_48;
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x165927);
    AddRange(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98,
             in_stack_ffffffffffffff94);
    local_50 = &local_48;
    local_58._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::begin(in_stack_ffffffffffffff38);
    std::vector<int,_std::allocator<int>_>::end(in_stack_ffffffffffffff38);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         in_stack_ffffffffffffff40,
                         (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         in_stack_ffffffffffffff38);
      if (!bVar1) break;
      piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&local_58);
      iVar2 = *piVar3;
      in_stack_ffffffffffffff40 = (BenchmarkImp *)(in_RDI + 5);
      this_02 = (vector<int,_std::allocator<int>_> *)&stack0xffffffffffffff6c;
      piVar4 = (iterator)0x1;
      std::allocator<int>::allocator((allocator<int> *)0x1659d7);
      __l._M_len = in_stack_ffffffffffffff80;
      __l._M_array = piVar4;
      std::vector<int,_std::allocator<int>_>::vector
                (this_02,__l,(allocator_type *)CONCAT44(iVar2,in_stack_ffffffffffffff68));
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::push_back((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      std::vector<int,_std::allocator<int>_>::~vector(this_00);
      std::allocator<int>::~allocator((allocator<int> *)0x165a17);
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&local_58);
    }
    std::vector<int,_std::allocator<int>_>::~vector(this_00);
    return;
  }
  CheckHandler::~CheckHandler((CheckHandler *)&LAB_001658ee);
}

Assistant:

void BenchmarkImp::Range(int start, int limit) {
  CHECK(ArgsCnt() == -1 || ArgsCnt() == 1);
  std::vector<int> arglist;
  AddRange(&arglist, start, limit, range_multiplier_);

  for (int i : arglist) {
    args_.push_back({i});
  }
}